

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

tuple<const_int_*,_unsigned_int,_unsigned_int> __thiscall
immutable::rrb_region_for<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t index)

{
  rrb_size_table<false> *prVar1;
  rrb<int,_false,_6> *prVar2;
  internal_node<int,_false> *node;
  int *extraout_RDX;
  int *extraout_RDX_00;
  _Head_base<0UL,_const_int_*,_false> _Var3;
  int *extraout_RDX_01;
  uint uVar4;
  uint32_t uVar5;
  tuple<const_int_*,_unsigned_int,_unsigned_int> tVar6;
  uint32_t local_2c;
  
  local_2c = index;
  prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
  if (index < prVar2->cnt) {
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    uVar5 = prVar2->cnt;
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    uVar4 = uVar5 - prVar2->tail_len;
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
    if (index < uVar4) {
      node = (internal_node<int,_false> *)(prVar2->root).ptr;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
      _Var3._M_head_impl = extraout_RDX;
      for (uVar5 = prVar2->shift; uVar5 != 0; uVar5 = uVar5 - 6) {
        if ((node->size_table).ptr == (rrb_size_table<false> *)0x0) {
          node = node->child[local_2c >> ((byte)uVar5 & 0x1f) & 0x3f].ptr;
        }
        else {
          node = rrb_details::sized<int,false>(node,&local_2c,uVar5);
          _Var3._M_head_impl = extraout_RDX_00;
        }
      }
      uVar4 = index - (local_2c & 0x3f);
      uVar5 = node->len + uVar4;
    }
    else {
      node = (internal_node<int,_false> *)
             ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar2->tail);
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(rrb);
      uVar5 = prVar2->cnt;
      _Var3._M_head_impl = extraout_RDX_01;
    }
    prVar1 = (node->size_table).ptr;
    *(uint32_t *)this = uVar5;
    *(uint *)(this + 4) = uVar4;
    *(rrb_size_table<false> **)(this + 8) = prVar1;
    tVar6.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_const_int_*,_false>._M_head_impl = _Var3._M_head_impl;
    tVar6.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
    return (tuple<const_int_*,_unsigned_int,_unsigned_int>)
           tVar6.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>;
  }
  __assert_fail("index < rrb->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x7e0,
                "std::tuple<const T *, uint32_t, uint32_t> immutable::rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
               );
}

Assistant:

inline std::tuple<const T*, uint32_t, uint32_t> rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t index)
    {
    using namespace rrb_details;
    assert(index < rrb->cnt);
    const uint32_t tail_offset = rrb->cnt - rrb->tail_len;
    if (tail_offset <= index)
      {
      return std::make_tuple(rrb->tail->child, tail_offset, rrb->cnt);
      }
    else
      {
      const uint32_t original_index = index;
      const internal_node<T, atomic_ref_counting>* current = (const internal_node<T, atomic_ref_counting>*)rrb->root.ptr;
      for (uint32_t shift = rrb->shift; shift > 0; shift -= bits<N>::rrb_bits)
        {
        if (current->size_table.ptr == nullptr)
          {
          const uint32_t subidx = (index >> shift) & bits<N>::rrb_mask;
          current = current->child[subidx].ptr;
          }
        else
          {
          current = sized(current, &index, shift);
          }
        }
      const uint32_t index_of_first_element = original_index - (index & bits<N>::rrb_mask);
      return std::make_tuple(((const leaf_node<T, atomic_ref_counting>*)current)->child, index_of_first_element, index_of_first_element + ((const leaf_node<T, atomic_ref_counting>*)current)->len);
      }
    }